

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t validate_time_flag(archive *_a,wchar_t flag,char *_fn)

{
  int iVar1;
  uint in_ESI;
  archive *in_RDI;
  wchar_t magic_test;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  wchar_t local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else if ((in_ESI & 0xfc00) == 0) {
    if ((in_ESI & 0x300) == 0) {
      archive_set_error(in_RDI,0x16,"No time flag");
      local_4 = L'\xffffffe7';
    }
    else if ((in_ESI & 0xec) == 0) {
      if ((in_ESI & 0x13) == 0) {
        archive_set_error(in_RDI,0x16,"No comparison flag");
        local_4 = L'\xffffffe7';
      }
      else {
        local_4 = L'\0';
      }
    }
    else {
      archive_set_error(in_RDI,0x16,"Invalid comparison flag");
      local_4 = L'\xffffffe7';
    }
  }
  else {
    archive_set_error(in_RDI,0x16,"Invalid time flag");
    local_4 = L'\xffffffe7';
  }
  return local_4;
}

Assistant:

static int
validate_time_flag(struct archive *_a, int flag, const char *_fn)
{
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, _fn);

	/* Check a type of time. */
	if (flag &
	   ((~(ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME)) & 0xff00)) {
		archive_set_error(_a, EINVAL, "Invalid time flag");
		return (ARCHIVE_FAILED);
	}
	if ((flag & (ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME)) == 0) {
		archive_set_error(_a, EINVAL, "No time flag");
		return (ARCHIVE_FAILED);
	}

	/* Check a type of comparison. */
	if (flag &
	   ((~(ARCHIVE_MATCH_NEWER | ARCHIVE_MATCH_OLDER
			| ARCHIVE_MATCH_EQUAL)) & 0x00ff)) {
		archive_set_error(_a, EINVAL, "Invalid comparison flag");
		return (ARCHIVE_FAILED);
	}
	if ((flag & (ARCHIVE_MATCH_NEWER | ARCHIVE_MATCH_OLDER
	    | ARCHIVE_MATCH_EQUAL)) == 0) {
		archive_set_error(_a, EINVAL, "No comparison flag");
		return (ARCHIVE_FAILED);
	}

	return (ARCHIVE_OK);
}